

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

SearchResult * search::search(SearchResult *__return_storage_ptr__,Position *pos,int depth)

{
  SearchGlobals search_globals;
  array<search::SearchStack,_128UL> search_stack;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> local_b50;
  SearchGlobals local_b40;
  _Optional_payload_base<libchess::UCIGoParameters> local_aa8;
  SearchStack local_a30 [128];
  
  TranspositionTable::clear(&tt);
  SearchStack::new_search_stack();
  local_b50.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.
  _M_engaged = false;
  local_aa8._M_engaged = false;
  SearchGlobals::new_search_globals
            (&local_b40,&local_b50,(optional<libchess::UCIGoParameters> *)&local_aa8);
  std::_Optional_payload_base<libchess::UCIGoParameters>::_M_reset(&local_aa8);
  search_impl(__return_storage_ptr__,pos,-0x7531,0x7531,depth,local_a30,&local_b40);
  std::_Optional_payload_base<libchess::UCIGoParameters>::_M_reset
            ((_Optional_payload_base<libchess::UCIGoParameters> *)&local_b40.go_parameters_);
  return __return_storage_ptr__;
}

Assistant:

SearchResult search(Position& pos, int depth) {
    tt.clear();
    auto search_stack = SearchStack::new_search_stack();
    auto search_globals = SearchGlobals::new_search_globals();
    int alpha = -INFINITE;
    int beta = +INFINITE;
    SearchResult search_result =
        search_impl(pos, alpha, beta, depth, search_stack.begin(), search_globals);
    return search_result;
}